

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
atoiTest_testUint64OutOfBoundsNegative_Test::TestBody
          (atoiTest_testUint64OutOfBoundsNegative_Test *this)

{
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  atoiTest_testUint64OutOfBoundsNegative_Test *local_10;
  atoiTest_testUint64OutOfBoundsNegative_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_30,"-1111111111111111111111111111111111111111111111111111111111111",
             &local_31);
  test<unsigned_long>(false,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"-1111111111111111111111111111111111111",&local_69);
  test<unsigned_long>(false,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"-9223372036854775809",&local_91);
  test<unsigned_long>(false,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"-9223372036854775808",&local_b9);
  test<unsigned_long>(false,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"-9223372036854775807",&local_e1);
  test<unsigned_long>(false,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"-10000",&local_109);
  test<unsigned_long>(false,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"-10000",&local_131);
  test<unsigned_long>(false,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"-1",&local_159);
  test<unsigned_long>(false,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"-0",&local_181);
  test<unsigned_long>(false,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  return;
}

Assistant:

TEST(atoiTest, testUint64OutOfBoundsNegative) {
  // out of bounds
  test<uint64_t>(false, "-1111111111111111111111111111111111111111111111111111111111111");
  test<uint64_t>(false, "-1111111111111111111111111111111111111");
  test<uint64_t>(false, "-9223372036854775809"); 
  test<uint64_t>(false, "-9223372036854775808");
  test<uint64_t>(false, "-9223372036854775807");
  test<uint64_t>(false, "-10000");
  test<uint64_t>(false, "-10000");
  test<uint64_t>(false, "-1");
  test<uint64_t>(false, "-0");
}